

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Op soul::StructuralParser::getOpForTypeMetaFunctionName(QualifiedIdentifier *qi)

{
  bool bVar1;
  IdentifierPath local_e0;
  string *local_88;
  IdentifierPath local_70;
  QualifiedIdentifier *local_18;
  QualifiedIdentifier *qi_local;
  
  local_18 = qi;
  AST::QualifiedIdentifier::getPath(&local_70,qi);
  bVar1 = IdentifierPath::isUnqualified(&local_70);
  IdentifierPath::~IdentifierPath(&local_70);
  if (bVar1) {
    AST::QualifiedIdentifier::getPath(&local_e0,local_18);
    local_88 = (string *)IdentifierPath::getFirstPart(&local_e0);
    qi_local._4_4_ = AST::TypeMetaFunction::getOperationForName((Identifier)local_88);
    IdentifierPath::~IdentifierPath(&local_e0);
  }
  else {
    qi_local._4_4_ = none;
  }
  return qi_local._4_4_;
}

Assistant:

static AST::TypeMetaFunction::Op getOpForTypeMetaFunctionName (const AST::QualifiedIdentifier& qi)
    {
        if (qi.getPath().isUnqualified())
            return AST::TypeMetaFunction::getOperationForName (qi.getPath().getFirstPart());

        return AST::TypeMetaFunction::Op::none;
    }